

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void yang_print_parsed_body(lys_ypr_ctx *pctx,lysp_module *modp)

{
  byte *pbVar1;
  ushort uVar2;
  lysp_feature *plVar3;
  lysp_tpdf *plVar4;
  lysp_node_grp *grp;
  lysp_node *node;
  lysp_node_augment *aug;
  lysp_node_action *action;
  lysp_node_notif *notif;
  lysp_deviation *plVar5;
  ly_out *out;
  lysp_deviate *plVar6;
  long lVar7;
  uint16_t uVar8;
  uint uVar9;
  lysp_ext_instance *plVar10;
  lysp_ext_instance *plVar11;
  char *pcVar12;
  lysc_ext *plVar13;
  char *pcVar14;
  ulong uVar15;
  lysp_ext_instance *plVar16;
  uint16_t *puVar17;
  ulong uVar18;
  lysp_ext *plVar19;
  lysc_ext *plVar20;
  long lVar21;
  lysp_ext_instance *plVar22;
  lysp_ident *plVar23;
  lysp_deviate *plVar24;
  ly_bool flag;
  ly_bool local_44;
  ly_bool local_43;
  ly_bool local_42;
  ly_bool local_41;
  lysp_module *local_40;
  lysp_ext_instance *local_38;
  
  plVar20 = (lysc_ext *)0x0;
  local_40 = modp;
  while( true ) {
    plVar19 = local_40->extensions;
    if (plVar19 == (lysp_ext *)0x0) {
      plVar13 = (lysc_ext *)0x0;
    }
    else {
      plVar13 = plVar19[-1].compiled;
    }
    if (plVar13 <= plVar20) break;
    uVar2 = (pctx->field_0).field_0.flags;
    if (((uVar2 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar2 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    uVar18 = 0;
    plVar19 = local_40->extensions + (long)plVar20;
    local_44 = '\0';
    local_43 = '\0';
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar18 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    ly_print_((pctx->field_0).field_0.out,"%*sextension %s",uVar18,"",plVar19->name);
    puVar17 = &(pctx->field_0).field_0.level;
    *puVar17 = *puVar17 + 1;
    yprp_extension_instances(pctx,LY_STMT_EXTENSION,'\0',plVar19->exts,&local_44);
    if (plVar19->argname != (char *)0x0) {
      if (local_44 == '\0') {
        local_44 = '\x01';
        ly_print_((pctx->field_0).field_0.out," {\n");
      }
      uVar18 = 0;
      if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
          (undefined1  [24])0x0) {
        uVar18 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_((pctx->field_0).field_0.out,"%*sargument %s",uVar18,"");
      puVar17 = &(pctx->field_0).field_0.level;
      *puVar17 = *puVar17 + 1;
      if (plVar19->exts != (lysp_ext_instance *)0x0) {
        plVar22 = (lysp_ext_instance *)0xffffffffffffffff;
        while( true ) {
          plVar22 = (lysp_ext_instance *)
                    lysp_ext_instance_iter
                              (plVar19->exts,(uint64_t)((long)&plVar22->name + 1),LY_STMT_ARGUMENT);
          plVar11 = plVar19->exts;
          if (plVar11 == (lysp_ext_instance *)0x0) {
            plVar10 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar10 = plVar11[-1].exts;
          }
          if (plVar22 == plVar10) break;
          yprp_extension_instance(pctx,LY_STMT_ARGUMENT,'\0',plVar11 + (long)plVar22,&local_43);
        }
      }
      if ((plVar19->flags & 0x180) == 0) {
        if (plVar19->exts != (lysp_ext_instance *)0x0) {
          plVar11 = (lysp_ext_instance *)lysp_ext_instance_iter(plVar19->exts,0,LY_STMT_YIN_ELEMENT)
          ;
          plVar22 = (lysp_ext_instance *)0x0;
          if (plVar19->exts != (lysp_ext_instance *)0x0) {
            plVar22 = plVar19->exts[-1].exts;
          }
          if (plVar11 != plVar22) goto LAB_0018f015;
        }
      }
      else {
LAB_0018f015:
        if (local_43 == '\0') {
          local_43 = '\x01';
          ly_print_((pctx->field_0).field_0.out," {\n");
        }
        pcVar14 = "true";
        if (-1 < (char)plVar19->flags) {
          pcVar14 = "false";
        }
        ypr_substmt(pctx,LY_STMT_YIN_ELEMENT,'\0',pcVar14,'\0',plVar19->exts);
      }
      puVar17 = &(pctx->field_0).field_0.level;
      *puVar17 = *puVar17 - 1;
      ypr_close(pctx,local_43);
    }
    ypr_status(pctx,plVar19->flags,plVar19->exts,&local_44);
    ypr_description(pctx,plVar19->dsc,plVar19->exts,&local_44);
    ypr_reference(pctx,plVar19->ref,plVar19->exts,&local_44);
    puVar17 = &(pctx->field_0).field_0.level;
    *puVar17 = *puVar17 - 1;
    ypr_close(pctx,local_44);
    plVar20 = (lysc_ext *)((long)&plVar20->name + 1);
  }
  if (plVar19 != (lysp_ext *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  plVar22 = local_40->exts;
  puVar17 = &plVar22->flags;
  plVar11 = (lysp_ext_instance *)0xffffffffffffffff;
  do {
    if (plVar22 == (lysp_ext_instance *)0x0) {
      plVar10 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar10 = plVar22[-1].exts;
    }
    plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
    if (plVar10 <= plVar11) goto LAB_0018f197;
    uVar8 = *puVar17;
    puVar17 = puVar17 + 0x38;
  } while ((uVar8 & 0x1000) != 0);
  if (plVar11 < plVar10) {
    uVar2 = (pctx->field_0).field_0.flags;
    if (((uVar2 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar2 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_extension_instances(pctx,LY_STMT_MODULE,'\0',local_40->exts,(ly_bool *)0x0);
  }
LAB_0018f197:
  if (local_40->exts != (lysp_ext_instance *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  lVar21 = 0x38;
  uVar18 = 0;
  while( true ) {
    plVar3 = local_40->features;
    if (plVar3 == (lysp_feature *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(ulong *)&plVar3[-1].flags;
    }
    if (uVar15 <= uVar18) break;
    uVar2 = (pctx->field_0).field_0.flags;
    if (((uVar2 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar2 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    plVar3 = local_40->features;
    local_41 = '\0';
    uVar15 = 0;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar15 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    ly_print_((pctx->field_0).field_0.out,"%*sfeature %s",uVar15,"",
              *(undefined8 *)((long)plVar3 + lVar21 + -0x38));
    puVar17 = &(pctx->field_0).field_0.level;
    *puVar17 = *puVar17 + 1;
    yprp_extension_instances
              (pctx,LY_STMT_FEATURE,'\0',*(lysp_ext_instance **)((long)plVar3 + lVar21 + -8),
               &local_41);
    yprp_iffeatures(pctx,*(lysp_qname **)((long)plVar3 + lVar21 + -0x30),
                    *(lysp_ext_instance **)((long)plVar3 + lVar21 + -8),&local_41);
    ypr_status(pctx,*(uint16_t *)((long)&plVar3->name + lVar21),
               *(void **)((long)plVar3 + lVar21 + -8),&local_41);
    ypr_description(pctx,*(char **)((long)plVar3 + lVar21 + -0x18),
                    *(void **)((long)plVar3 + lVar21 + -8),&local_41);
    ypr_reference(pctx,*(char **)((long)plVar3 + lVar21 + -0x10),
                  *(void **)((long)plVar3 + lVar21 + -8),&local_41);
    puVar17 = &(pctx->field_0).field_0.level;
    *puVar17 = *puVar17 - 1;
    ypr_close(pctx,local_41);
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
    uVar18 = uVar18 + 1;
    lVar21 = lVar21 + 0x40;
  }
  if (plVar3 != (lysp_feature *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  uVar18 = 0;
  while( true ) {
    plVar23 = local_40->identities;
    if (plVar23 == (lysp_ident *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(ulong *)&plVar23[-1].flags;
    }
    if (uVar15 <= uVar18) break;
    uVar2 = (pctx->field_0).field_0.flags;
    if (((uVar2 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar2 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    plVar23 = local_40->identities + uVar18;
    local_42 = '\0';
    uVar15 = 0;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar15 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    ly_print_((pctx->field_0).field_0.out,"%*sidentity %s",uVar15,"",plVar23->name);
    puVar17 = &(pctx->field_0).field_0.level;
    *puVar17 = *puVar17 + 1;
    yprp_extension_instances(pctx,LY_STMT_IDENTITY,'\0',plVar23->exts,&local_42);
    yprp_iffeatures(pctx,plVar23->iffeatures,plVar23->exts,&local_42);
    pcVar14 = (char *)0x0;
    while( true ) {
      if (plVar23->bases == (char **)0x0) {
        pcVar12 = (char *)0x0;
      }
      else {
        pcVar12 = plVar23->bases[-1];
      }
      if (pcVar12 <= pcVar14) break;
      if (local_42 == '\0') {
        local_42 = '\x01';
        ly_print_((pctx->field_0).field_0.out," {\n");
      }
      ypr_substmt(pctx,LY_STMT_BASE,(uint8_t)pcVar14,plVar23->bases[(long)pcVar14],'\0',
                  plVar23->exts);
      pcVar14 = pcVar14 + 1;
    }
    ypr_status(pctx,plVar23->flags,plVar23->exts,&local_42);
    ypr_description(pctx,plVar23->dsc,plVar23->exts,&local_42);
    ypr_reference(pctx,plVar23->ref,plVar23->exts,&local_42);
    puVar17 = &(pctx->field_0).field_0.level;
    *puVar17 = *puVar17 - 1;
    ypr_close(pctx,local_42);
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
    uVar18 = uVar18 + 1;
  }
  if (plVar23 != (lysp_ident *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  lVar21 = 0;
  uVar18 = 0;
  while( true ) {
    plVar4 = local_40->typedefs;
    if (plVar4 == (lysp_tpdf *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(ulong *)&plVar4[-1].flags;
    }
    if (uVar15 <= uVar18) break;
    uVar2 = (pctx->field_0).field_0.flags;
    if (((uVar2 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar2 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_typedef(pctx,(lysp_tpdf *)((long)&local_40->typedefs->name + lVar21));
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
    uVar18 = uVar18 + 1;
    lVar21 = lVar21 + 0xb0;
  }
  if (plVar4 != (lysp_tpdf *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  for (grp = local_40->groupings; grp != (lysp_node_grp *)0x0; grp = (grp->field_0).field_1.next) {
    uVar2 = (pctx->field_0).field_0.flags;
    if (((uVar2 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar2 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_grouping(pctx,grp);
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  if (local_40->groupings != (lysp_node_grp *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  for (node = local_40->data; node != (lysp_node *)0x0; node = node->next) {
    uVar2 = (pctx->field_0).field_0.flags;
    if (((uVar2 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar2 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_node(pctx,node);
  }
  if (local_40->data != (lysp_node *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  for (aug = local_40->augments; aug != (lysp_node_augment *)0x0; aug = (aug->field_0).field_1.next)
  {
    uVar2 = (pctx->field_0).field_0.flags;
    if (((uVar2 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar2 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_augment(pctx,aug);
  }
  if (local_40->augments != (lysp_node_augment *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  for (action = local_40->rpcs; action != (lysp_node_action *)0x0;
      action = (action->field_0).field_1.next) {
    uVar2 = (pctx->field_0).field_0.flags;
    if (((uVar2 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar2 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_action(pctx,action);
  }
  if (local_40->rpcs != (lysp_node_action *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  for (notif = local_40->notifs; notif != (lysp_node_notif *)0x0;
      notif = (notif->field_0).field_1.next) {
    uVar2 = (pctx->field_0).field_0.flags;
    if (((uVar2 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar2 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_notification(pctx,notif);
  }
  if (local_40->notifs != (lysp_node_notif *)0x0) {
    pbVar1 = (byte *)((long)&pctx->field_0 + 10);
    *pbVar1 = *pbVar1 | 1;
  }
  plVar22 = (lysp_ext_instance *)0x0;
  do {
    plVar5 = local_40->deviations;
    if (plVar5 == (lysp_deviation *)0x0) {
      plVar11 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar11 = plVar5[-1].exts;
    }
    if (plVar11 <= plVar22) {
      if (plVar5 != (lysp_deviation *)0x0) {
        pbVar1 = (byte *)((long)&pctx->field_0 + 10);
        *pbVar1 = *pbVar1 | 1;
      }
      return;
    }
    uVar2 = (pctx->field_0).field_0.flags;
    if (((uVar2 & 1) != 0) &&
       ((pctx->field_0).field_0.flags = uVar2 & 0xfffe,
       (undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
       (undefined1  [24])0x0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    uVar18 = 0;
    plVar5 = local_40->deviations;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar18 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
    }
    local_38 = plVar22;
    ly_print_((pctx->field_0).field_0.out,"%*sdeviation \"%s\" {\n",uVar18,"");
    puVar17 = &(pctx->field_0).field_0.level;
    *puVar17 = *puVar17 + 1;
    yprp_extension_instances(pctx,LY_STMT_DEVIATION,'\0',plVar5[(long)plVar22].exts,(ly_bool *)0x0);
    if (plVar5[(long)plVar22].dsc != (char *)0x0) {
      ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',plVar5[(long)plVar22].dsc,'\0',
                  plVar5[(long)plVar22].exts);
    }
    if (plVar5[(long)plVar22].ref != (char *)0x0) {
      ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',plVar5[(long)plVar22].ref,'\0',
                  plVar5[(long)plVar22].exts);
    }
    for (plVar24 = plVar5[(long)plVar22].deviates; plVar24 != (lysp_deviate *)0x0;
        plVar24 = plVar24->next) {
      uVar18 = 0;
      if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
          (undefined1  [24])0x0) {
        uVar18 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_((pctx->field_0).field_0.out,"%*sdeviate ",uVar18,"");
      switch(plVar24->mod) {
      case '\x01':
        out = (pctx->field_0).field_0.out;
        if (plVar24->exts != (lysp_ext_instance *)0x0) {
          ly_print_(out,"not-supported {\n");
          puVar17 = &(pctx->field_0).field_0.level;
          *puVar17 = *puVar17 + 1;
          yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar24->exts,(ly_bool *)0x0);
          break;
        }
        ly_print_(out,"not-supported;\n");
        goto LAB_0018fb7f;
      case '\x02':
        ly_print_((pctx->field_0).field_0.out,"add {\n");
        puVar17 = &(pctx->field_0).field_0.level;
        *puVar17 = *puVar17 + 1;
        yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar24->exts,(ly_bool *)0x0);
        plVar22 = plVar24->exts;
        ypr_substmt(pctx,LY_STMT_UNITS,'\0',*(char **)(plVar24 + 1),'\0',plVar22);
        lVar21 = 0;
        plVar11 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar6 = plVar24[1].next;
          if (plVar6 == (lysp_deviate *)0x0) {
            plVar10 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar10 = plVar6[-1].exts;
          }
          if (plVar10 <= plVar11) break;
          yprp_restr(pctx,(lysp_restr *)(&plVar6->mod + lVar21),LY_STMT_MUST,(ly_bool *)0x0);
          plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
          lVar21 = lVar21 + 0x40;
        }
        lVar21 = 0x10;
        plVar11 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar10 = plVar24[1].exts;
          if (plVar10 == (lysp_ext_instance *)0x0) {
            plVar16 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar16 = plVar10[-1].exts;
          }
          if (plVar16 <= plVar11) break;
          plVar22 = plVar24->exts;
          ypr_substmt(pctx,LY_STMT_UNIQUE,(uint8_t)plVar11,
                      *(char **)((long)plVar10 + lVar21 + -0x10),
                      *(byte *)((long)&plVar10->name + lVar21 + 1) & 1,plVar22);
          plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
          lVar21 = lVar21 + 0x18;
        }
        lVar21 = 0x10;
        uVar18 = 0;
        while( true ) {
          lVar7 = *(long *)(plVar24 + 2);
          if (lVar7 == 0) {
            uVar15 = 0;
          }
          else {
            uVar15 = *(ulong *)(lVar7 + -8);
          }
          if (uVar15 <= uVar18) break;
          plVar22 = plVar24->exts;
          ypr_substmt(pctx,LY_STMT_DEFAULT,(uint8_t)uVar18,*(char **)(lVar7 + -0x10 + lVar21),
                      *(byte *)(lVar7 + 1 + lVar21) & 1,plVar22);
          uVar18 = uVar18 + 1;
          lVar21 = lVar21 + 0x18;
        }
        ypr_config(pctx,*(uint16_t *)&plVar24[2].next,plVar24->exts,(ly_bool *)0x0);
        ypr_mandatory(pctx,*(uint16_t *)&plVar24[2].next,plVar24->exts,(ly_bool *)0x0);
        if (((ulong)plVar24[2].next & 0x200) != 0) {
          ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,(uint8_t)plVar24->exts,
                       (void *)(ulong)*(uint *)((long)&plVar24[2].next + 4),0,(ly_bool *)plVar22);
        }
        if (((ulong)plVar24[2].next & 0x400) != 0) {
          uVar9 = *(uint *)&plVar24[2].exts;
LAB_0018fb22:
          plVar22 = plVar24->exts;
          if ((void *)(ulong)uVar9 == (void *)0x0) {
            ypr_substmt(pctx,LY_STMT_MAX_ELEMENTS,'\0',"unbounded",'\0',plVar22);
          }
          else {
            ypr_unsigned(pctx,LY_STMT_MAX_ELEMENTS,(uint8_t)plVar22,(void *)(ulong)uVar9,0,
                         (ly_bool *)plVar22);
          }
        }
        break;
      case '\x03':
        ly_print_((pctx->field_0).field_0.out,"delete {\n");
        puVar17 = &(pctx->field_0).field_0.level;
        *puVar17 = *puVar17 + 1;
        yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar24->exts,(ly_bool *)0x0);
        ypr_substmt(pctx,LY_STMT_UNITS,'\0',*(char **)(plVar24 + 1),'\0',plVar24->exts);
        lVar21 = 0;
        plVar22 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar6 = plVar24[1].next;
          if (plVar6 == (lysp_deviate *)0x0) {
            plVar11 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar11 = plVar6[-1].exts;
          }
          if (plVar11 <= plVar22) break;
          yprp_restr(pctx,(lysp_restr *)(&plVar6->mod + lVar21),LY_STMT_MUST,(ly_bool *)0x0);
          plVar22 = (lysp_ext_instance *)((long)&plVar22->name + 1);
          lVar21 = lVar21 + 0x40;
        }
        lVar21 = 0x10;
        plVar22 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar11 = plVar24[1].exts;
          if (plVar11 == (lysp_ext_instance *)0x0) {
            plVar10 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar10 = plVar11[-1].exts;
          }
          if (plVar10 <= plVar22) break;
          ypr_substmt(pctx,LY_STMT_UNIQUE,(uint8_t)plVar22,
                      *(char **)((long)plVar11 + lVar21 + -0x10),
                      *(byte *)((long)&plVar11->name + lVar21 + 1) & 1,plVar24->exts);
          plVar22 = (lysp_ext_instance *)((long)&plVar22->name + 1);
          lVar21 = lVar21 + 0x18;
        }
        lVar21 = 0x10;
        uVar18 = 0;
        while( true ) {
          lVar7 = *(long *)(plVar24 + 2);
          if (lVar7 == 0) {
            uVar15 = 0;
          }
          else {
            uVar15 = *(ulong *)(lVar7 + -8);
          }
          if (uVar15 <= uVar18) break;
          ypr_substmt(pctx,LY_STMT_DEFAULT,(uint8_t)uVar18,*(char **)(lVar7 + -0x10 + lVar21),
                      *(byte *)(lVar7 + 1 + lVar21) & 1,plVar24->exts);
          uVar18 = uVar18 + 1;
          lVar21 = lVar21 + 0x18;
        }
        break;
      case '\x04':
        ly_print_((pctx->field_0).field_0.out,"replace {\n");
        puVar17 = &(pctx->field_0).field_0.level;
        *puVar17 = *puVar17 + 1;
        yprp_extension_instances(pctx,LY_STMT_DEVIATE,'\0',plVar24->exts,(ly_bool *)0x0);
        if (*(lysp_type **)(plVar24 + 1) != (lysp_type *)0x0) {
          yprp_type(pctx,*(lysp_type **)(plVar24 + 1));
        }
        ypr_substmt(pctx,LY_STMT_UNITS,'\0',(char *)plVar24[1].next,'\0',plVar24->exts);
        plVar22 = plVar24->exts;
        ypr_substmt(pctx,LY_STMT_DEFAULT,'\0',(char *)plVar24[1].exts,
                    *(byte *)((long)&plVar24[2].next + 1) & 1,plVar22);
        ypr_config(pctx,*(uint16_t *)&plVar24[2].exts,plVar24->exts,(ly_bool *)0x0);
        ypr_mandatory(pctx,*(uint16_t *)&plVar24[2].exts,plVar24->exts,(ly_bool *)0x0);
        if (((ulong)plVar24[2].exts & 0x200) != 0) {
          ypr_unsigned(pctx,LY_STMT_MIN_ELEMENTS,(uint8_t)plVar24->exts,
                       (void *)(ulong)*(uint *)((long)&plVar24[2].exts + 4),0,(ly_bool *)plVar22);
        }
        if (((ulong)plVar24[2].exts & 0x400) != 0) {
          uVar9 = *(uint *)(plVar24 + 3);
          goto LAB_0018fb22;
        }
      }
      uVar9 = *(int *)((long)&pctx->field_0 + 8) - 1;
      (pctx->field_0).field_0.level = (uint16_t)uVar9;
      uVar9 = (uVar9 & 0xffff) * 2;
      if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
          (undefined1  [24])0x0) {
        uVar9 = 0;
      }
      ly_print_((pctx->field_0).field_0.out,"%*s}\n",(ulong)uVar9,"");
LAB_0018fb7f:
    }
    uVar9 = *(int *)((long)&pctx->field_0 + 8) - 1;
    (pctx->field_0).field_0.level = (uint16_t)uVar9;
    uVar9 = (uVar9 & 0xffff) * 2;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) !=
        (undefined1  [24])0x0) {
      uVar9 = 0;
    }
    ly_print_((pctx->field_0).field_0.out,"%*s}\n",(ulong)uVar9);
    plVar22 = (lysp_ext_instance *)((long)&local_38->name + 1);
  } while( true );
}

Assistant:

static void
yang_print_parsed_body(struct lys_ypr_ctx *pctx, const struct lysp_module *modp)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_node *data;
    struct lysp_node_action *action;
    struct lysp_node_notif *notif;
    struct lysp_node_grp *grp;
    struct lysp_node_augment *aug;

    LY_ARRAY_FOR(modp->extensions, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_extension(pctx, &modp->extensions[u]);
    }

    YPR_EXTRA_LINE(modp->extensions, pctx);

    if (yprp_extension_has_printable_instances(modp->exts)) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_extension_instances(pctx, LY_STMT_MODULE, 0, modp->exts, NULL);
    }

    YPR_EXTRA_LINE(modp->exts, pctx);

    LY_ARRAY_FOR(modp->features, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_feature(pctx, &modp->features[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->features, pctx);

    LY_ARRAY_FOR(modp->identities, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_identity(pctx, &modp->identities[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->identities, pctx);

    LY_ARRAY_FOR(modp->typedefs, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_typedef(pctx, &modp->typedefs[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->typedefs, pctx);

    LY_LIST_FOR(modp->groupings, grp) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_grouping(pctx, grp);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->groupings, pctx);

    LY_LIST_FOR(modp->data, data) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_node(pctx, data);
    }

    YPR_EXTRA_LINE(modp->data, pctx);

    LY_LIST_FOR(modp->augments, aug) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_augment(pctx, aug);
    }

    YPR_EXTRA_LINE(modp->augments, pctx);

    LY_LIST_FOR(modp->rpcs, action) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_action(pctx, action);
    }

    YPR_EXTRA_LINE(modp->rpcs, pctx);

    LY_LIST_FOR(modp->notifs, notif) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_notification(pctx, notif);
    }

    YPR_EXTRA_LINE(modp->notifs, pctx);

    LY_ARRAY_FOR(modp->deviations, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_deviation(pctx, &modp->deviations[u]);
    }

    YPR_EXTRA_LINE(modp->deviations, pctx);
}